

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Builder * __thiscall
capnproto_test::capnp::test::TestDefaults::Builder::getDataList
          (Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  local_28.pointer = (this->_builder).pointers + 0x10;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  ::capnp::_::PointerBuilder::getList
            (&__return_storage_ptr__->builder,&local_28,POINTER,(word *)&DAT_0047e018);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::Data,  ::capnp::Kind::BLOB>::Builder TestDefaults::Builder::getDataList() {
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::Data,  ::capnp::Kind::BLOB>>::get(_builder.getPointerField(
      ::capnp::bounded<16>() * ::capnp::POINTERS),
        ::capnp::schemas::bp_eb3f9ebe98c73cb6 + 822);
}